

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_split_multipleDelimiters_discardEmpty_fn(int _i)

{
  int iVar1;
  ASplittedString *splitted;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x152bc6;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,";01;;23;",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x152c09;
  splitted = AString_split(&string,';',true);
  if (string.capacity != 8) {
    pcStack_60 = "(8)";
    pcVar5 = "(string).capacity == (8)";
    pcVar6 = "(string).capacity";
    pcVar2 = (char *)string.capacity;
LAB_00152ff8:
    iVar1 = 0xa3e;
LAB_0015336e:
    local_58 = (char *)0x8;
LAB_00153374:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar4 = &pcStack_60;
    goto LAB_00153376;
  }
  uStack_50 = 0x152c2a;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa3e);
  if (string.buffer == (char *)0x0) {
    pcVar2 = "(void*) (string).buffer != NULL";
    pcVar5 = "(void*) (string).buffer";
    iVar1 = 0xa3e;
    goto LAB_001532da;
  }
  uStack_50 = 0x152c47;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0xa3e);
  pcVar7 = string.buffer;
  if (string.buffer == (char *)0x0) {
    pcVar2 = "";
    pcVar7 = "(null)";
LAB_00152f8c:
    pcStack_60 = ";01;;23;";
    pcStack_70 = "(\";01;;23;\")";
    pcVar5 = "(string).buffer == (\";01;;23;\")";
    pcVar6 = "(string).buffer";
    iVar1 = 0xa3e;
  }
  else {
    uStack_50 = 0x152c67;
    iVar1 = strcmp(";01;;23;",string.buffer);
    if (iVar1 != 0) {
      pcVar2 = "\"";
      goto LAB_00152f8c;
    }
    uStack_50 = 0x152c80;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa3e);
    if (string.size != 8) {
      pcStack_60 = "strlen(\";01;;23;\")";
      pcVar5 = "(string).size == strlen(\";01;;23;\")";
      pcVar6 = "(string).size";
      pcVar2 = (char *)string.size;
      goto LAB_00152ff8;
    }
    uStack_50 = 0x152ca0;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa3e);
    if (splitted == (ASplittedString *)0x0) {
      pcVar2 = "(void*) splitted != NULL";
      pcVar5 = "(void*) splitted";
      iVar1 = 0xa3f;
LAB_001532da:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      pcStack_60 = (char *)0x1532e1;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar1,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x",pcVar2,pcVar5);
    }
    uStack_50 = 0x152cba;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa3f);
    uStack_50 = 0x152cc2;
    pcVar2 = (char *)private_ACUtils_ADynArray_size(splitted);
    if (pcVar2 != (char *)0x2) {
      pcStack_60 = "2";
      pcVar5 = "private_ACUtils_ADynArray_size(splitted) == 2";
      pcVar6 = "private_ACUtils_ADynArray_size(splitted)";
      iVar1 = 0xa40;
LAB_0015326d:
      local_58 = (char *)0x2;
      goto LAB_00153374;
    }
    uStack_50 = 0x152cdd;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa40);
    pcVar2 = (char *)(*splitted->buffer)->capacity;
    if (pcVar2 != (char *)0x8) {
      pcStack_60 = "(8)";
      pcVar5 = "(*(splitted->buffer[0])).capacity == (8)";
      pcVar6 = "(*(splitted->buffer[0])).capacity";
      iVar1 = 0xa41;
      goto LAB_0015336e;
    }
    uStack_50 = 0x152d03;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa41);
    if ((*splitted->buffer)->buffer == (char *)0x0) {
      pcVar2 = "(void*) (*(splitted->buffer[0])).buffer != NULL";
      pcVar5 = "(void*) (*(splitted->buffer[0])).buffer";
      iVar1 = 0xa41;
      goto LAB_001532da;
    }
    uStack_50 = 0x152d26;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0xa41);
    pcVar7 = (*splitted->buffer)->buffer;
    if (pcVar7 == (char *)0x0) {
      pcVar2 = "";
      pcVar7 = "(null)";
LAB_001530f4:
      pcStack_60 = "01";
      pcStack_70 = "(\"01\")";
      pcVar5 = "(*(splitted->buffer[0])).buffer == (\"01\")";
      pcVar6 = "(*(splitted->buffer[0])).buffer";
      iVar1 = 0xa41;
    }
    else {
      uStack_50 = 0x152d49;
      iVar1 = strcmp("01",pcVar7);
      if (iVar1 != 0) {
        pcVar2 = "\"";
        goto LAB_001530f4;
      }
      uStack_50 = 0x152d62;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa41);
      pcVar2 = (char *)(*splitted->buffer)->size;
      if (pcVar2 != (char *)0x2) {
        pcStack_60 = "strlen(\"01\")";
        pcVar5 = "(*(splitted->buffer[0])).size == strlen(\"01\")";
        pcVar6 = "(*(splitted->buffer[0])).size";
        iVar1 = 0xa41;
        goto LAB_0015326d;
      }
      uStack_50 = 0x152d88;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa41);
      pcVar2 = (char *)splitted->buffer[1]->capacity;
      if (pcVar2 != (char *)0x8) {
        pcStack_60 = "(8)";
        pcVar5 = "(*(splitted->buffer[1])).capacity == (8)";
        pcVar6 = "(*(splitted->buffer[1])).capacity";
        iVar1 = 0xa42;
        goto LAB_0015336e;
      }
      uStack_50 = 0x152daf;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa42);
      if (splitted->buffer[1]->buffer == (char *)0x0) {
        pcVar2 = "(void*) (*(splitted->buffer[1])).buffer != NULL";
        pcVar5 = "(void*) (*(splitted->buffer[1])).buffer";
        iVar1 = 0xa42;
        goto LAB_001532da;
      }
      uStack_50 = 0x152dd3;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0xa42);
      pcVar7 = splitted->buffer[1]->buffer;
      if (pcVar7 == (char *)0x0) {
        pcVar2 = "";
        pcVar7 = "(null)";
      }
      else {
        uStack_50 = 0x152df7;
        iVar1 = strcmp("23",pcVar7);
        if (iVar1 == 0) {
          uStack_50 = 0x152e10;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa42);
          pcVar2 = (char *)splitted->buffer[1]->size;
          if (pcVar2 != (char *)0x2) {
            pcStack_60 = "strlen(\"23\")";
            pcVar5 = "(*(splitted->buffer[1])).size == strlen(\"23\")";
            pcVar6 = "(*(splitted->buffer[1])).size";
            iVar1 = 0xa42;
            goto LAB_0015326d;
          }
          uStack_50 = 0x152e37;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0xa42);
          uStack_50 = 0x152e3f;
          AString_freeSplitted(splitted);
          if (string.capacity == 8) {
            uStack_50 = 0x152e5f;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa44);
            if (string.buffer == (char *)0x0) {
              pcVar2 = "(void*) (string).buffer != NULL";
              pcVar5 = "(void*) (string).buffer";
              iVar1 = 0xa44;
              goto LAB_001532da;
            }
            uStack_50 = 0x152e7c;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0xa44);
            pcVar7 = string.buffer;
            if (string.buffer == (char *)0x0) {
              pcVar7 = "(null)";
              pcVar2 = "";
            }
            else {
              uStack_50 = 0x152e99;
              iVar1 = strcmp(";01;;23;",string.buffer);
              if (iVar1 == 0) {
                uStack_50 = 0x152eb2;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0xa44);
                if (string.size == 8) {
                  uStack_50 = 0x152ed2;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0xa44);
                  local_58 = (char *)private_ACUtilsTest_AString_freeCount;
                  if (private_ACUtilsTest_AString_reallocCount ==
                      private_ACUtilsTest_AString_freeCount) {
                    uStack_50 = 0x152efa;
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0xa45);
                    uStack_50 = 0x152f03;
                    (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))
                              (string.buffer);
                    return;
                  }
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar5 = 
                  "private_ACUtilsTest_AString_reallocCount == (private_ACUtilsTest_AString_freeCount)"
                  ;
                  pcVar6 = "private_ACUtilsTest_AString_reallocCount";
                  iVar1 = 0xa45;
                  ppcVar4 = &pcStack_60;
                  pcStack_60 = "(private_ACUtilsTest_AString_freeCount)";
                  pcVar2 = (char *)private_ACUtilsTest_AString_reallocCount;
                  goto LAB_00153376;
                }
                pcStack_60 = "strlen(\";01;;23;\")";
                pcVar5 = "(string).size == strlen(\";01;;23;\")";
                pcVar6 = "(string).size";
                pcVar2 = (char *)string.size;
                goto LAB_00153369;
              }
              pcVar2 = "\"";
            }
            expr = 
            "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
            ;
            pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
            pcVar5 = "(string).buffer == (\";01;;23;\")";
            pcVar6 = "(string).buffer";
            iVar1 = 0xa44;
            local_58 = "\"";
            pcStack_60 = ";01;;23;";
            pcStack_68 = "\"";
            pcStack_70 = "(\";01;;23;\")";
            ppcVar4 = &pcStack_80;
            pcStack_80 = pcVar7;
            pcStack_78 = pcVar2;
            goto LAB_00153376;
          }
          pcStack_60 = "(8)";
          pcVar5 = "(string).capacity == (8)";
          pcVar6 = "(string).capacity";
          pcVar2 = (char *)string.capacity;
LAB_00153369:
          iVar1 = 0xa44;
          goto LAB_0015336e;
        }
        pcVar2 = "\"";
      }
      pcStack_60 = "23";
      pcStack_70 = "(\"23\")";
      pcVar5 = "(*(splitted->buffer[1])).buffer == (\"23\")";
      pcVar6 = "(*(splitted->buffer[1])).buffer";
      iVar1 = 0xa42;
    }
  }
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_58 = "\"";
  pcStack_68 = "\"";
  ppcVar4 = &pcStack_80;
  pcStack_80 = pcVar7;
  pcStack_78 = pcVar2;
LAB_00153376:
  uStack_50 = 0;
  *(char **)((long)ppcVar4 + -8) = pcVar2;
  *(undefined8 *)((long)ppcVar4 + -0x10) = 0x15337d;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar5,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_split_multipleDelimiters_discardEmpty)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString(";01;;23;", 8);
    struct ASplittedString *splitted;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    splitted = AString_split(&string, ';', true);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASSERT_PTR_NONNULL(splitted);
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_size(splitted), 2);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 0), "01", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*ADynArray_get(splitted, 1), "23", 8);
    AString_freeSplitted(splitted);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, ";01;;23;", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(private_ACUtilsTest_AString_freeCount);
    private_ACUtilsTest_AString_destructTestString(string);
}